

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dominator_tree.cpp
# Opt level: O2

DominatorTreeNode * __thiscall
spvtools::opt::DominatorTree::GetOrInsertNode(DominatorTree *this,BasicBlock *bb)

{
  uint32_t uVar1;
  iterator iVar2;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>,_bool>
  pVar3;
  pair<unsigned_int,_spvtools::opt::DominatorTreeNode> local_90;
  DominatorTreeNode local_58;
  
  local_90.first = BasicBlock::id(bb);
  iVar2 = std::
          _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>,_std::_Select1st<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spvtools::opt::DominatorTreeNode>_>_>
          ::find(&(this->nodes_)._M_t,&local_90.first);
  if ((_Rb_tree_header *)iVar2._M_node == &(this->nodes_)._M_t._M_impl.super__Rb_tree_header) {
    uVar1 = BasicBlock::id(bb);
    DominatorTreeNode::DominatorTreeNode(&local_58,bb);
    local_90.second.bb_ = local_58.bb_;
    local_90.second.parent_ = local_58.parent_;
    local_90.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_58.children_.
         super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_90.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_58.children_.
         super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_90.second.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_58.children_.
         super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_90.second.dfs_num_pre_ = local_58.dfs_num_pre_;
    local_90.second.dfs_num_post_ = local_58.dfs_num_post_;
    local_58.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_58.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_58.children_.
    super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_90.first = uVar1;
    pVar3 = std::
            _Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
            ::_M_emplace_unique<std::pair<unsigned_int,spvtools::opt::DominatorTreeNode>>
                      ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>,std::_Select1st<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,spvtools::opt::DominatorTreeNode>>>
                        *)&this->nodes_,&local_90);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    std::
    _Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::~_Vector_base(&local_90.second.children_.
                     super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   );
    std::
    _Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
    ::~_Vector_base(&local_58.children_.
                     super__Vector_base<spvtools::opt::DominatorTreeNode_*,_std::allocator<spvtools::opt::DominatorTreeNode_*>_>
                   );
  }
  return (DominatorTreeNode *)&iVar2._M_node[1]._M_parent;
}

Assistant:

DominatorTreeNode* DominatorTree::GetOrInsertNode(BasicBlock* bb) {
  DominatorTreeNode* dtn = nullptr;

  std::map<uint32_t, DominatorTreeNode>::iterator node_iter =
      nodes_.find(bb->id());
  if (node_iter == nodes_.end()) {
    dtn = &nodes_.emplace(std::make_pair(bb->id(), DominatorTreeNode{bb}))
               .first->second;
  } else {
    dtn = &node_iter->second;
  }

  return dtn;
}